

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeSetDoc(xmlNodePtr node,xmlDocPtr doc)

{
  xmlDocPtr doc_00;
  int iVar1;
  xmlChar *pxVar2;
  xmlEntityPtr pxVar3;
  xmlDictPtr local_58;
  xmlDictPtr local_50;
  xmlEntityPtr ent;
  xmlAttrPtr attr;
  int ret;
  xmlDictPtr newDict;
  xmlDictPtr oldDict;
  xmlDocPtr oldDoc;
  xmlDocPtr doc_local;
  xmlNodePtr node_local;
  
  attr._4_4_ = 0;
  doc_00 = node->doc;
  if (doc_00 == (xmlDocPtr)0x0) {
    local_50 = (xmlDictPtr)0x0;
  }
  else {
    local_50 = doc_00->dict;
  }
  if (doc == (xmlDocPtr)0x0) {
    local_58 = (xmlDictPtr)0x0;
  }
  else {
    local_58 = doc->dict;
  }
  if ((local_50 != (xmlDictPtr)0x0) && (local_50 != local_58)) {
    if (((node->name != (xmlChar *)0x0) &&
        ((((node->type == XML_ELEMENT_NODE || (node->type == XML_ATTRIBUTE_NODE)) ||
          (node->type == XML_PI_NODE)) || (node->type == XML_ENTITY_REF_NODE)))) &&
       (iVar1 = xmlDictOwns(local_50,node->name), iVar1 != 0)) {
      if (local_58 == (xmlDictPtr)0x0) {
        pxVar2 = xmlStrdup(node->name);
        node->name = pxVar2;
      }
      else {
        pxVar2 = xmlDictLookup(local_58,node->name,-1);
        node->name = pxVar2;
      }
      if (node->name == (xmlChar *)0x0) {
        attr._4_4_ = -1;
      }
    }
    if (((node->content != (xmlChar *)0x0) &&
        ((node->type == XML_TEXT_NODE || (node->type == XML_CDATA_SECTION_NODE)))) &&
       (iVar1 = xmlDictOwns(local_50,node->content), iVar1 != 0)) {
      pxVar2 = xmlStrdup(node->content);
      node->content = pxVar2;
      if (node->content == (xmlChar *)0x0) {
        attr._4_4_ = -1;
      }
    }
  }
  switch(node->type) {
  case XML_ATTRIBUTE_NODE:
    if (*(int *)&node->content == 2) {
      xmlRemoveID(doc_00,(xmlAttrPtr)node);
    }
    break;
  default:
    break;
  case XML_ENTITY_REF_NODE:
    node->children = (_xmlNode *)0x0;
    node->last = (_xmlNode *)0x0;
    node->content = (xmlChar *)0x0;
    if (((doc != (xmlDocPtr)0x0) &&
        ((doc->intSubset != (_xmlDtd *)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) &&
       (pxVar3 = xmlGetDocEntity(doc,node->name), pxVar3 != (xmlEntityPtr)0x0)) {
      node->children = (_xmlNode *)pxVar3;
      node->last = (_xmlNode *)pxVar3;
      node->content = pxVar3->content;
    }
    break;
  case XML_DTD_NODE:
    if (doc_00 != (xmlDocPtr)0x0) {
      if (doc_00->intSubset == (_xmlDtd *)node) {
        doc_00->intSubset = (_xmlDtd *)0x0;
      }
      if (doc_00->extSubset == (_xmlDtd *)node) {
        doc_00->extSubset = (_xmlDtd *)0x0;
      }
    }
    break;
  case XML_ENTITY_DECL:
    xmlRemoveEntity((xmlEntityPtr)node);
  }
  node->doc = doc;
  return attr._4_4_;
}

Assistant:

static int
xmlNodeSetDoc(xmlNodePtr node, xmlDocPtr doc) {
    xmlDocPtr oldDoc;
    xmlDictPtr oldDict, newDict;
    int ret = 0;

    /*
     * Remove name and content from old dictionary
     */

    oldDoc = node->doc;
    oldDict = oldDoc ? oldDoc->dict : NULL;
    newDict = doc ? doc->dict : NULL;

    if ((oldDict != NULL) && (oldDict != newDict)) {
        if ((node->name != NULL) &&
            ((node->type == XML_ELEMENT_NODE) ||
             (node->type == XML_ATTRIBUTE_NODE) ||
             (node->type == XML_PI_NODE) ||
             (node->type == XML_ENTITY_REF_NODE)) &&
            (xmlDictOwns(oldDict, node->name))) {
            if (newDict)
                node->name = xmlDictLookup(newDict, node->name, -1);
            else
                node->name = xmlStrdup(node->name);
            if (node->name == NULL)
                ret = -1;
        }

        if ((node->content != NULL) &&
            ((node->type == XML_TEXT_NODE) ||
             (node->type == XML_CDATA_SECTION_NODE)) &&
            (xmlDictOwns(oldDict, node->content))) {
            node->content = xmlStrdup(node->content);
            if (node->content == NULL)
                ret = -1;
        }
    }

    switch (node->type) {
        case XML_ATTRIBUTE_NODE: {
            xmlAttrPtr attr = (xmlAttrPtr) node;

            /*
             * Handle IDs
             *
             * TODO: ID attributes should also be added to the new
             * document, but it's not clear how to handle clashes.
             */
            if (attr->atype == XML_ATTRIBUTE_ID)
                xmlRemoveID(oldDoc, attr);

            break;
        }

        case XML_ENTITY_REF_NODE:
            /*
             * Handle entity references
             */
            node->children = NULL;
            node->last = NULL;
            node->content = NULL;

            if ((doc != NULL) &&
                ((doc->intSubset != NULL) || (doc->extSubset != NULL))) {
                xmlEntityPtr ent;

                /*
                * Assign new entity node if available
                */
                ent = xmlGetDocEntity(doc, node->name);
                if (ent != NULL) {
                    node->children = (xmlNodePtr) ent;
                    node->last = (xmlNodePtr) ent;
                    node->content = ent->content;
                }
            }

            break;

        case XML_DTD_NODE:
            if (oldDoc != NULL) {
                if (oldDoc->intSubset == (xmlDtdPtr) node)
                    oldDoc->intSubset = NULL;
                if (oldDoc->extSubset == (xmlDtdPtr) node)
                    oldDoc->extSubset = NULL;
            }

            break;

        case XML_ENTITY_DECL:
            xmlRemoveEntity((xmlEntityPtr) node);
            break;

        /*
         * TODO:
         * - Remove element decls from doc->elements
         * - Remove attribtue decls form doc->attributes
         */

        default:
            break;
    }

    /*
     * Set new document
     */
    node->doc = doc;

    return(ret);
}